

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionCallFinal
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,ArrayView<FunctionValue> functions
          ,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,bool allowFailure)

{
  bool *pbVar1;
  long lVar2;
  Lexeme *pLVar3;
  SynIdentifier *pSVar4;
  _func_int **pp_Var5;
  Allocator *pAVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  InplaceStr functionName;
  InplaceStr functionName_00;
  FunctionValue proto;
  FunctionValue proto_00;
  FunctionValue proto_01;
  FunctionValue proto_02;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<unsigned_int> ratings_00;
  ArrayView<unsigned_int> ratings_01;
  undefined1 auVar15 [12];
  bool bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeBase *pTVar20;
  TypeFunction *pTVar21;
  char *pcVar22;
  size_t sVar23;
  ExprBase *pEVar24;
  undefined8 *puVar25;
  TypeRef *pTVar26;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ExprBase *pEVar27;
  FunctionData *pFVar28;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  ExpressionContext *pEVar29;
  undefined4 extraout_var_14;
  int iVar30;
  uint uVar31;
  FunctionValue *pFVar32;
  ulong uVar33;
  char *pcVar34;
  TypeHandle *pTVar35;
  FunctionData **ppFVar36;
  MatchData *pMVar37;
  ExprTypeLiteral *typeLiteral;
  ModuleData *pMVar38;
  long lVar39;
  ExpressionContext *pEVar40;
  FunctionData *pFVar41;
  ExpressionContext *this;
  char *pcVar42;
  TypeHandle *pTVar43;
  ArgumentData *pAVar44;
  ulong uVar45;
  SynBase *pSVar46;
  bool bVar47;
  undefined4 uVar48;
  uint uVar49;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> functionArguments_00;
  ArrayView<ArgumentData> functionArguments_01;
  InplaceStr name;
  ArrayView<ArgumentData> functionArguments_02;
  ArrayView<FunctionValue> functions_02;
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  IntrusiveList<TypeHandle> generics_02;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<TypeHandle> generics_03;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<CallArgumentData> arguments_02;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<CallArgumentData> arguments_04;
  ArrayView<ArgumentData> arguments_05;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_06;
  IntrusiveList<ExprBase> actualArguments;
  IntrusiveList<MatchData> aliasesB;
  IntrusiveList<MatchData> aliasesA;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<CallArgumentData,_16U> resultB;
  IntrusiveList<ExprBase> errorArguments;
  undefined4 uVar50;
  TypeFunction *local_928;
  ExprFunctionAccess *local_918;
  char *local_900;
  ExpressionContext *local_8f0;
  FunctionValue local_8e8;
  IntrusiveList<ExprBase> local_8c8;
  TypeBase *local_8b0;
  TypeFunction *local_8a8;
  SynBase *local_8a0;
  FunctionData *pFStack_898;
  undefined8 *local_890;
  SynBase *local_888;
  FunctionData *pFStack_880;
  undefined8 *local_878;
  SynBase *local_870;
  FunctionData *pFStack_868;
  undefined8 *local_860;
  ModuleData *local_858;
  uint uStack_850;
  undefined4 uStack_84c;
  FunctionValue *local_848;
  uint uStack_840;
  undefined4 uStack_83c;
  ModuleData *local_838;
  uint uStack_830;
  undefined4 uStack_82c;
  FunctionValue *local_828;
  uint uStack_820;
  undefined4 uStack_81c;
  IntrusiveList<MatchData> local_818;
  IntrusiveList<MatchData> local_808;
  undefined1 local_7f8 [8];
  ModuleData *pMStack_7f0;
  ModuleData local_7e8;
  Allocator *local_768;
  undefined1 local_760 [264];
  undefined8 uStack_658;
  ModuleData *local_650;
  undefined1 local_648 [16];
  undefined1 local_638 [8];
  bool local_630 [8];
  TypeBase *local_628;
  TypeBase *local_620;
  TypeBase *local_618;
  FunctionData *local_610;
  SynIdentifier *local_538;
  ModuleData *local_4b8;
  Allocator *local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_13;
  
  pFVar32 = functions.data;
  if ((value == (ExprBase *)0x0) || (value->type == (TypeBase *)0x0)) {
    bVar47 = false;
  }
  else {
    bVar47 = value->type->typeID == 0;
  }
  uVar18 = functions.count;
  uVar45 = (ulong)arguments.count;
  pTVar35 = generics.head;
  if (uVar45 != 0) {
    lVar39 = 0;
    do {
      lVar2 = *(long *)((long)&(arguments.data)->value + lVar39);
      if (((*(long *)(lVar2 + 0x18) != 0) && (*(int *)(*(long *)(lVar2 + 0x18) + 8) == 0)) ||
         ((*(int *)(lVar2 + 8) == 8 &&
          (bVar16 = AssertResolvableType(ctx,source,*(TypeBase **)(lVar2 + 0x30),false), !bVar16))))
      {
        bVar47 = true;
      }
      lVar39 = lVar39 + 0x30;
    } while (uVar45 * 0x30 != lVar39);
  }
  for (; pTVar35 != (TypeHandle *)0x0; pTVar35 = pTVar35->next) {
    pTVar20 = pTVar35->type;
    if (((pTVar20 != (TypeBase *)0x0) && (pTVar20->typeID == 0)) ||
       (bVar16 = AssertResolvableType(ctx,source,pTVar20,false), !bVar16)) {
      bVar47 = true;
    }
  }
  pEVar29 = (ExpressionContext *)(ulong)uVar18;
  if (bVar47) {
    local_648._0_4_ = 0;
    local_648._4_4_ = 0;
    local_648._8_4_ = 0;
    local_648._12_4_ = 0;
    if (uVar45 != 0) {
      lVar39 = 0;
      do {
        iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        if (uVar45 * 0x30 == lVar39) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x22a,
                        "T &ArrayView<ArgumentData>::operator[](unsigned int) [T = ArgumentData]");
        }
        pEVar24 = *(ExprBase **)((long)&(arguments.data)->value + lVar39);
        ExprPassthrough::ExprPassthrough
                  ((ExprPassthrough *)CONCAT44(extraout_var,iVar17),pEVar24->source,pEVar24->type,
                   pEVar24);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)local_648,(ExprBase *)CONCAT44(extraout_var,iVar17));
        lVar39 = lVar39 + 0x30;
      } while (uVar45 * 0x30 != lVar39);
    }
    iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar24 = (ExprBase *)CONCAT44(extraout_var_00,iVar17);
    pTVar20 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar24->typeID = 0x29;
    pEVar24->source = source;
    pEVar24->type = pTVar20;
    pEVar24->next = (ExprBase *)0x0;
    pEVar24->listed = false;
    pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f28;
    pEVar24[1]._vptr_ExprBase = (_func_int **)value;
    goto LAB_0014fa73;
  }
  if (value == (ExprBase *)0x0) {
    local_928 = (TypeFunction *)0x0;
  }
  else {
    local_928 = (TypeFunction *)value->type;
    if ((local_928 == (TypeFunction *)0x0) || ((local_928->super_TypeBase).typeID != 0x15)) {
      local_928 = (TypeFunction *)0x0;
    }
  }
  local_8c8.head = (ExprBase *)0x0;
  local_8c8.tail = (ExprBase *)0x0;
  auVar15 = arguments._0_12_;
  if (uVar18 != 0) {
    local_768 = ctx->allocator;
    local_7f8 = (undefined1  [8])&local_7e8;
    pMStack_7f0 = (ModuleData *)0x2000000000;
    functions_02._12_4_ = 0;
    functions_02.data = (FunctionValue *)SUB128(functions._0_12_,0);
    functions_02.count = SUB124(functions._0_12_,8);
    SelectBestFunction(&local_8e8,ctx,source,functions_02,generics,arguments,
                       (SmallArray<unsigned_int,_32U> *)local_7f8);
    pFVar41 = local_8e8.function;
    if (local_8e8.function == (FunctionData *)0x0) {
      if (allowFailure) {
        pEVar24 = (ExprBase *)0x0;
        goto LAB_00150ef5;
      }
      if (((value != (ExprBase *)0x0) && (arguments.count == 1)) &&
         ((value->typeID == 8 &&
          (((TypeStruct *)(arguments.data)->type == ctx->typeAutoRef &&
           ((arguments.data)->name == (SynIdentifier *)0x0)))))) {
        pEVar24 = CreateCast(ctx,source,(arguments.data)->value,(TypeBase *)value[1]._vptr_ExprBase,
                             true);
        pEVar27 = pFVar32->context;
        if ((pEVar27 == (ExprBase *)0x0) || (pEVar27->typeID != 9)) {
          pEVar24 = CreateAssignment(ctx,source,pEVar27,pEVar24);
        }
        goto LAB_00150ef5;
      }
      pcVar22 = ctx->errorBuf;
      if ((pcVar22 != (char *)0x0) && (ctx->errorBufSize != 0)) {
        if (ctx->errorCount == 0) {
          ctx->errorPos = (source->pos).begin;
          ctx->errorBufLocation = pcVar22;
          pcVar42 = pcVar22;
        }
        else {
          pcVar42 = ctx->errorBufLocation;
        }
        pSVar4 = pFVar32->function->name;
        NULLC::SafeSprintf(pcVar42,(ulong)(ctx->errorBufSize + ((int)pcVar22 - (int)pcVar42)),
                           "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                           (ulong)(uint)(*(int *)&(pSVar4->name).end - (int)(pSVar4->name).begin));
        pcVar22 = ctx->errorBufLocation;
        sVar23 = strlen(pcVar22);
        pcVar22 = pcVar22 + sVar23;
        ctx->errorBufLocation = pcVar22;
        pSVar4 = pFVar32->function->name;
        local_838 = (ModuleData *)local_7f8;
        uStack_830 = (uint)pMStack_7f0;
        ratings_01._12_4_ = uStack_82c;
        ratings_01.count = (uint)pMStack_7f0;
        functions_01._12_4_ = uStack_81c;
        functions_01.count = uVar18;
        functionName_00.end._4_4_ = (int)((ulong)(pSVar4->name).end >> 0x20);
        functionName_00._0_12_ = *(undefined1 (*) [12])&pSVar4->name;
        functions_01.data = pFVar32;
        ratings_01.data = (uint *)local_7f8;
        local_828 = pFVar32;
        uStack_820 = uVar18;
        ReportOnFunctionSelectError
                  (ctx,source,pcVar22,(*(int *)&ctx->errorBuf - (int)pcVar22) + ctx->errorBufSize,
                   pcVar42,functionName_00,functions_01,generics,arguments,ratings_01,0xffffffff,
                   true);
        pcVar22 = ctx->errorBufLocation;
        sVar23 = strlen(pcVar22);
        ctx->errorBufLocation = pcVar22 + sVar23;
      }
      if (ctx->errorHandlerNested == true) {
        if (ctx->errorHandlerActive == false) {
          __assert_fail("ctx.errorHandlerActive",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x1d49,
                        "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                       );
        }
LAB_001514df:
        longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
      }
      ctx->errorCount = ctx->errorCount + 1;
      local_648._0_4_ = 0;
      local_648._4_4_ = 0;
      local_648._8_4_ = 0;
      local_648._12_4_ = 0;
      if (uVar45 != 0) {
        lVar39 = 0;
        do {
          iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar24 = *(ExprBase **)((long)&(arguments.data)->value + lVar39);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var_10,iVar17),pEVar24->source,
                     pEVar24->type,pEVar24);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)local_648,
                     (ExprBase *)CONCAT44(extraout_var_10,iVar17));
          lVar39 = lVar39 + 0x30;
        } while (uVar45 * 0x30 != lVar39);
      }
      iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar24 = (ExprBase *)CONCAT44(extraout_var_11,iVar17);
      pTVar20 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar24->typeID = 0x29;
      pEVar24->source = source;
LAB_00150ec1:
      pEVar24->type = pTVar20;
      pEVar24->next = (ExprBase *)0x0;
      pEVar24->listed = false;
      pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f28;
      pEVar24[1]._vptr_ExprBase = (_func_int **)value;
      uVar18 = local_648._0_4_;
      uVar48 = local_648._4_4_;
      uVar31 = local_648._8_4_;
      uVar49 = local_648._12_4_;
    }
    else {
      ppFVar36 = &pFVar32->function;
      pAVar44 = (ArgumentData *)0xffffffff;
      this = (ExpressionContext *)0x0;
      do {
        if (*ppFVar36 == local_8e8.function) {
          if ((ExpressionContext *)((ulong)pMStack_7f0 & 0xffffffff) <= this) goto LAB_00151360;
          pAVar44 = (ArgumentData *)(ulong)*(uint *)((long)(SynBase **)local_7f8 + (long)this * 4);
        }
        this = (ExpressionContext *)((long)&this->optimizationLevel + 1);
        ppFVar36 = ppFVar36 + 3;
      } while (pEVar29 != this);
      uVar31 = (uint)pAVar44;
      local_8b0 = (TypeBase *)local_8e8.context;
      ppFVar36 = &pFVar32->function;
      pEVar40 = (ExpressionContext *)0x0;
      do {
        pFVar28 = *ppFVar36;
        if (pFVar28 != pFVar41) {
          if ((ExpressionContext *)((ulong)pMStack_7f0 & 0xffffffff) <= pEVar40) {
LAB_00151360:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<unsigned int, 32>::operator[](unsigned int) [T = unsigned int, N = 32]"
                         );
          }
          if (*(uint *)((long)(SynBase **)local_7f8 + (long)pEVar40 * 4) != uVar31)
          goto LAB_0014fe21;
          pLVar3 = (Lexeme *)(local_8b0->name).end;
          if ((pLVar3 != (Lexeme *)0x0) && (*(int *)&pLVar3->pos == 0x10)) {
            bVar47 = ExpressionContext::IsGenericFunction(this,pFVar28);
            if (bVar47) {
              bVar47 = ExpressionContext::IsGenericFunction(this,pFVar41);
              if (bVar47) {
                local_808.head = (MatchData *)0x0;
                local_808.tail = (MatchData *)0x0;
                pSVar4 = (SynIdentifier *)ctx->allocator;
                memset((SynBase *)(local_648 + 0x10),0,0x100);
                local_648._8_4_ = 0;
                local_648._12_4_ = 0x10;
                uVar7 = (pFVar28->arguments).data;
                uVar8 = (pFVar28->arguments).count;
                functionArguments.count = uVar8;
                functionArguments.data = (ArgumentData *)uVar7;
                functionArguments._12_4_ = 0;
                arguments_01._12_4_ = 0;
                arguments_01.data = (ArgumentData *)auVar15._0_8_;
                arguments_01.count = auVar15._8_4_;
                local_538 = pSVar4;
                local_648._0_8_ = (SynBase *)(local_648 + 0x10);
                bVar47 = PrepareArgumentsForFunctionCall
                                   (ctx,source,functionArguments,arguments_01,
                                    (SmallArray<CallArgumentData,_16U> *)local_648,(uint *)0x0,false
                                   );
                if (bVar47) {
                  arguments_02.count = local_648._8_4_;
                  arguments_02.data = (CallArgumentData *)local_648._0_8_;
                  arguments_02._12_4_ = 0;
                  local_8a8 = GetGenericFunctionInstanceType
                                        (ctx,source,(*ppFVar36)->scope->ownerType,*ppFVar36,
                                         arguments_02,&local_808);
                }
                else {
                  local_8a8 = (TypeFunction *)0x0;
                }
                local_818.head = (MatchData *)0x0;
                local_818.tail = (MatchData *)0x0;
                pMVar38 = (ModuleData *)ctx->allocator;
                memset((ArgumentData *)(local_760 + 0x10),0,0x100);
                local_760._8_4_ = 0;
                local_760._12_4_ = 0x10;
                uVar9 = (pFVar41->arguments).data;
                uVar10 = (pFVar41->arguments).count;
                functionArguments_00.count = uVar10;
                functionArguments_00.data = (ArgumentData *)uVar9;
                functionArguments_00._12_4_ = 0;
                arguments_03._12_4_ = 0;
                arguments_03.data = (ArgumentData *)auVar15._0_8_;
                arguments_03.count = auVar15._8_4_;
                pAVar44 = arguments.data;
                local_760._0_8_ = (ArgumentData *)(local_760 + 0x10);
                local_650 = pMVar38;
                bVar47 = PrepareArgumentsForFunctionCall
                                   (ctx,source,functionArguments_00,arguments_03,
                                    (SmallArray<CallArgumentData,_16U> *)local_760,(uint *)0x0,false
                                   );
                if (bVar47) {
                  arguments_04.count = local_760._8_4_;
                  arguments_04.data = (CallArgumentData *)local_760._0_8_;
                  arguments_04._12_4_ = 0;
                  pAVar44 = (ArgumentData *)local_760._0_8_;
                  pTVar21 = GetGenericFunctionInstanceType
                                      (ctx,source,pFVar41->scope->ownerType,pFVar41,arguments_04,
                                       &local_818);
                }
                else {
                  pTVar21 = (TypeFunction *)0x0;
                }
                SmallArray<CallArgumentData,_16U>::~SmallArray
                          ((SmallArray<CallArgumentData,_16U> *)local_760);
                this = (ExpressionContext *)local_648;
                SmallArray<CallArgumentData,_16U>::~SmallArray
                          ((SmallArray<CallArgumentData,_16U> *)this);
                if (((local_8a8 == pTVar21) && (local_8a8 != (TypeFunction *)0x0)) &&
                   (pTVar21 != (TypeFunction *)0x0)) goto LAB_0014fe21;
              }
            }
          }
          pcVar22 = ctx->errorBuf;
          if ((pcVar22 != (char *)0x0) && (ctx->errorBufSize != 0)) {
            if (ctx->errorCount == 0) {
              ctx->errorPos = (source->pos).begin;
              ctx->errorBufLocation = pcVar22;
              pcVar42 = pcVar22;
            }
            else {
              pcVar42 = ctx->errorBufLocation;
            }
            NULLC::SafeSprintf(pcVar42,(ulong)(ctx->errorBufSize + ((int)pcVar22 - (int)pcVar42)),
                               "ERROR: ambiguity, there is more than one overloaded function available for the call:\n"
                              );
            pcVar22 = ctx->errorBufLocation;
            sVar23 = strlen(pcVar22);
            pcVar22 = pcVar22 + sVar23;
            ctx->errorBufLocation = pcVar22;
            pSVar4 = pFVar32->function->name;
            local_858 = (ModuleData *)local_7f8;
            uStack_850 = (uint)pMStack_7f0;
            ratings_00._12_4_ = uStack_84c;
            ratings_00.count = (uint)pMStack_7f0;
            functions_00._12_4_ = uStack_83c;
            functions_00.count = uVar18;
            functionName.end._4_4_ = (int)((ulong)(pSVar4->name).end >> 0x20);
            functionName._0_12_ = *(undefined1 (*) [12])&pSVar4->name;
            functions_00.data = pFVar32;
            ratings_00.data = (uint *)local_7f8;
            local_848 = pFVar32;
            uStack_840 = uVar18;
            ReportOnFunctionSelectError
                      (ctx,source,pcVar22,
                       (*(int *)&ctx->errorBuf - (int)pcVar22) + ctx->errorBufSize,pcVar42,
                       functionName,functions_00,generics,arguments,ratings_00,uVar31,true);
            pcVar22 = ctx->errorBufLocation;
            sVar23 = strlen(pcVar22);
            ctx->errorBufLocation = pcVar22 + sVar23;
          }
          if (ctx->errorHandlerNested != true) {
            ctx->errorCount = ctx->errorCount + 1;
            local_648._0_4_ = 0;
            local_648._4_4_ = 0;
            local_648._8_4_ = 0;
            local_648._12_4_ = 0;
            if (uVar45 != 0) {
              lVar39 = 0;
              do {
                iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                pEVar24 = *(ExprBase **)((long)&(arguments.data)->value + lVar39);
                ExprPassthrough::ExprPassthrough
                          ((ExprPassthrough *)CONCAT44(extraout_var_04,iVar17),pEVar24->source,
                           pEVar24->type,pEVar24);
                IntrusiveList<ExprBase>::push_back
                          ((IntrusiveList<ExprBase> *)local_648,
                           (ExprBase *)CONCAT44(extraout_var_04,iVar17));
                lVar39 = lVar39 + 0x30;
              } while (uVar45 * 0x30 != lVar39);
            }
            iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
            pEVar24 = (ExprBase *)CONCAT44(extraout_var_05,iVar17);
            pTVar20 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
            pEVar24->typeID = 0x29;
            pEVar24->source = source;
            goto LAB_00150ec1;
          }
          if (ctx->errorHandlerActive == false) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1d90,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          goto LAB_001514df;
        }
LAB_0014fe21:
        pEVar40 = (ExpressionContext *)((long)&pEVar40->optimizationLevel + 1);
        ppFVar36 = ppFVar36 + 3;
      } while (pEVar29 != pEVar40);
      local_928 = pFVar41->type;
      if ((local_928 == (TypeFunction *)0x0) || ((local_928->super_TypeBase).typeID != 0x15)) {
        local_928 = (TypeFunction *)0x0;
      }
      pLVar3 = (Lexeme *)(local_8b0->name).end;
      if ((pLVar3 != (Lexeme *)0x0) && (*(int *)&pLVar3->pos == 0x10)) {
        local_8f0 = (ExpressionContext *)(pFVar41->name->name).begin;
        local_900 = (pFVar41->name->name).end;
        this = local_8f0;
        if (pFVar41->scope->ownerType != (TypeBase *)0x0) {
          pcVar22 = strstr((char *)local_8f0,"::");
          if (pcVar22 != (char *)0x0) {
            local_8f0 = (ExpressionContext *)(pcVar22 + 2);
            this = local_8f0;
            sVar23 = strlen((char *)local_8f0);
            local_900 = pcVar22 + sVar23 + 2;
          }
        }
        local_8e8.function = pFVar41;
        if ((ctx->functions).count != 0) {
          uVar45 = 0;
          do {
            pFVar28 = (ctx->functions).data[uVar45];
            pTVar20 = pFVar28->scope->ownerType;
            if ((pTVar20 != (TypeBase *)0x0) &&
               ((pTVar20->isGeneric != false || ((pFVar28->type->super_TypeBase).isGeneric == true))
               )) {
              uVar18 = NULLC::StringHashContinue(pTVar20->nameHash,"::");
              this = (ExpressionContext *)(ulong)uVar18;
              uVar18 = NULLC::StringHashContinue(uVar18,(char *)local_8f0,local_900);
              if (pFVar28->nameHash == uVar18) {
                pMVar37 = (pFVar28->generics).head;
                iVar17 = 0;
                iVar30 = 0;
                if (pMVar37 != (MatchData *)0x0) {
                  iVar30 = 0;
                  do {
                    iVar30 = iVar30 + 1;
                    pMVar37 = pMVar37->next;
                  } while (pMVar37 != (MatchData *)0x0);
                }
                if (generics.head != (TypeHandle *)0x0) {
                  iVar17 = 0;
                  pTVar35 = generics.head;
                  do {
                    iVar17 = iVar17 + 1;
                    pTVar35 = pTVar35->next;
                  } while (pTVar35 != (TypeHandle *)0x0);
                }
                if (iVar30 == iVar17) {
                  pTVar35 = (pFVar28->type->arguments).head;
                  iVar17 = 0;
                  iVar30 = 0;
                  if (pTVar35 != (TypeHandle *)0x0) {
                    iVar30 = 0;
                    do {
                      iVar30 = iVar30 + 1;
                      pTVar35 = pTVar35->next;
                    } while (pTVar35 != (TypeHandle *)0x0);
                  }
                  pTVar35 = (pFVar41->type->arguments).head;
                  if (pTVar35 != (TypeHandle *)0x0) {
                    iVar17 = 0;
                    do {
                      iVar17 = iVar17 + 1;
                      pTVar35 = pTVar35->next;
                    } while (pTVar35 != (TypeHandle *)0x0);
                  }
                  if (iVar30 == iVar17) {
                    pTVar20 = pFVar28->scope->ownerType;
                    uVar48 = SUB84(pFVar28,0);
                    uVar50 = (undefined4)((ulong)pFVar28 >> 0x20);
                    if ((pTVar20 == (TypeBase *)0x0) || (pTVar20->typeID != 0x16)) {
                      iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                      puVar25 = (undefined8 *)CONCAT44(extraout_var_02,iVar17);
                      pTVar26 = ExpressionContext::GetReferenceType(ctx,pFVar28->scope->ownerType);
                      *(undefined4 *)(puVar25 + 1) = 9;
                      puVar25[2] = source;
                      puVar25[3] = pTVar26;
                      puVar25[4] = 0;
                      *(undefined1 *)(puVar25 + 5) = 0;
                      *puVar25 = &PTR__ExprBase_002235f0;
                      this = (ExpressionContext *)local_648;
                      proto_01.function._0_4_ = uVar48;
                      proto_01.source = source;
                      proto_01.function._4_4_ = uVar50;
                      proto_01.context._0_4_ = iVar17;
                      proto_01.context._4_4_ = extraout_var_02;
                      generics_02.tail = (TypeHandle *)pAVar44;
                      generics_02.head = generics.head;
                      local_8a0 = source;
                      pFStack_898 = pFVar28;
                      local_890 = puVar25;
                      CreateGenericFunctionInstance
                                ((FunctionValue *)this,ctx,source,proto_01,generics_02,arguments,
                                 true);
                    }
                    else {
                      this = (ExpressionContext *)&pTVar20[2].typeID;
                      uVar18 = 0;
                      while( true ) {
                        lVar39._0_4_ = pTVar20[2].typeID;
                        lVar39._4_4_ = pTVar20[2].nameHash;
                        uVar31 = 0;
                        if (lVar39 != 0) {
                          uVar31 = 0;
                          do {
                            uVar31 = uVar31 + 1;
                            lVar39 = *(long *)(lVar39 + 0x20);
                          } while (lVar39 != 0);
                        }
                        if (uVar31 <= uVar18) break;
                        pEVar24 = IntrusiveList<ExprBase>::operator[]
                                            ((IntrusiveList<ExprBase> *)this,uVar18);
                        if ((pEVar24 == (ExprBase *)0x0) || (pEVar24->typeID != 0x2d)) {
                          pEVar24 = (ExprBase *)0x0;
                        }
                        iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                        puVar25 = (undefined8 *)CONCAT44(extraout_var_01,iVar17);
                        pTVar26 = ExpressionContext::GetReferenceType
                                            (ctx,(TypeBase *)pEVar24[1]._vptr_ExprBase);
                        *(undefined4 *)(puVar25 + 1) = 9;
                        puVar25[2] = source;
                        puVar25[3] = pTVar26;
                        puVar25[4] = 0;
                        *(undefined1 *)(puVar25 + 5) = 0;
                        *puVar25 = &PTR__ExprBase_002235f0;
                        if (pFVar41->scope->ownerType->isGeneric == true) {
                          proto.function._0_4_ = uVar48;
                          proto.source = source;
                          proto.function._4_4_ = uVar50;
                          proto.context._0_4_ = iVar17;
                          proto.context._4_4_ = extraout_var_01;
                          generics_00.tail = (TypeHandle *)pAVar44;
                          generics_00.head = generics.head;
                          local_870 = source;
                          pFStack_868 = pFVar28;
                          local_860 = puVar25;
                          CreateGenericFunctionInstance
                                    ((FunctionValue *)local_648,ctx,source,proto,generics_00,
                                     arguments,false);
                          pFVar41 = (FunctionData *)CONCAT44(local_648._12_4_,local_648._8_4_);
                          local_928 = pFVar41->type;
                          if ((local_928 == (TypeFunction *)0x0) ||
                             ((local_928->super_TypeBase).typeID != 0x15)) {
                            local_928 = (TypeFunction *)0x0;
                          }
                        }
                        else {
                          proto_00.function._0_4_ = uVar48;
                          proto_00.source = source;
                          proto_00.function._4_4_ = uVar50;
                          proto_00.context._0_4_ = iVar17;
                          proto_00.context._4_4_ = extraout_var_01;
                          generics_01.tail = (TypeHandle *)pAVar44;
                          generics_01.head = generics.head;
                          local_888 = source;
                          pFStack_880 = pFVar28;
                          local_878 = puVar25;
                          CreateGenericFunctionInstance
                                    ((FunctionValue *)local_648,ctx,source,proto_00,generics_01,
                                     arguments,true);
                        }
                        uVar18 = uVar18 + 1;
                      }
                    }
                  }
                }
              }
            }
            uVar45 = uVar45 + 1;
            local_8e8.function = pFVar41;
          } while (uVar45 < (ctx->functions).count);
        }
      }
      bVar47 = ExpressionContext::IsGenericFunction(this,pFVar41);
      local_8e8.source = (SynBase *)CONCAT44(local_8e8.source._4_4_,local_8e8.source._0_4_);
      if (bVar47) {
        proto_02.source._4_4_ = local_8e8.source._4_4_;
        proto_02.source._0_4_ = local_8e8.source._0_4_;
        proto_02.function._0_4_ = (int)local_8e8.function;
        proto_02.function._4_4_ = (int)((ulong)local_8e8.function >> 0x20);
        proto_02.context._0_4_ = (int)local_8e8.context;
        proto_02.context._4_4_ = (int)((ulong)local_8e8.context >> 0x20);
        generics_03.tail = (TypeHandle *)pAVar44;
        generics_03.head = generics.head;
        CreateGenericFunctionInstance
                  ((FunctionValue *)local_648,ctx,source,proto_02,generics_03,arguments,false);
        local_8e8.context = (ExprBase *)local_638;
        local_8e8.function = (FunctionData *)CONCAT44(local_648._12_4_,local_648._8_4_);
        local_8e8.source = (SynBase *)local_648._0_8_;
        if (local_8e8.function != (FunctionData *)0x0) {
          local_928 = (local_8e8.function)->type;
          pFVar41 = local_8e8.function;
          goto LAB_00150a88;
        }
        iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar24 = (ExprBase *)CONCAT44(extraout_var_09,iVar17);
        pTVar20 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      }
      else {
LAB_00150a88:
        pEVar24 = local_8e8.context;
        if (local_928->returnType != ctx->typeAuto) {
          bVar47 = IsVirtualFunctionCall
                             (ctx,pFVar41,
                              (TypeBase *)((InplaceStr *)&(local_8e8.context)->source)->end);
          if (bVar47) {
            pEVar27 = GetFunctionTable(ctx,source,pFVar41);
            name.end = "";
            name.begin = "__redirect";
            pFVar28 = (FunctionData *)
                      CreateFunctionCall2(ctx,source,name,pEVar24,pEVar27,false,true,true);
            iVar17 = (*ctx->allocator->_vptr_Allocator[2])();
            local_918 = (ExprFunctionAccess *)CONCAT44(extraout_var_06,iVar17);
            pTVar21 = pFVar41->type;
            (local_918->super_ExprBase).typeID = 0x12;
            (local_918->super_ExprBase).source = source;
            (local_918->super_ExprBase).type = &pTVar21->super_TypeBase;
            (local_918->super_ExprBase).next = (ExprBase *)0x0;
            (local_918->super_ExprBase).listed = false;
            (local_918->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002239e8;
            local_918->function = pFVar28;
            *(undefined4 *)&local_918->context = 0xd;
          }
          else {
            iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            local_918 = (ExprFunctionAccess *)CONCAT44(extraout_var_08,iVar17);
            ExprFunctionAccess::ExprFunctionAccess
                      (local_918,local_8e8.source,&pFVar41->type->super_TypeBase,pFVar41,pEVar24);
          }
          pSVar4 = (SynIdentifier *)ctx->allocator;
          memset((SynBase *)(local_648 + 0x10),0,0x100);
          local_648._8_4_ = 0;
          local_648._12_4_ = 0x10;
          uVar11 = (pFVar41->arguments).data;
          uVar12 = (pFVar41->arguments).count;
          functionArguments_02.count = uVar12;
          functionArguments_02.data = (ArgumentData *)uVar11;
          functionArguments_02._12_4_ = 0;
          arguments_06._12_4_ = 0;
          arguments_06.data = (ArgumentData *)auVar15._0_8_;
          arguments_06.count = auVar15._8_4_;
          local_538 = pSVar4;
          local_648._0_8_ = (SynBase *)(local_648 + 0x10);
          PrepareArgumentsForFunctionCall
                    (ctx,source,functionArguments_02,arguments_06,
                     (SmallArray<CallArgumentData,_16U> *)local_648,(uint *)0x0,true);
          if (local_648._8_4_ != 0) {
            lVar39 = 8;
            uVar45 = 0;
            do {
              IntrusiveList<ExprBase>::push_back
                        (&local_8c8,
                         *(ExprBase **)((long)&((SynBase *)local_648._0_8_)->_vptr_SynBase + lVar39)
                        );
              uVar45 = uVar45 + 1;
              lVar39 = lVar39 + 0x10;
            } while (uVar45 < (uint)local_648._8_4_);
          }
          SmallArray<CallArgumentData,_16U>::~SmallArray
                    ((SmallArray<CallArgumentData,_16U> *)local_648);
          SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)local_7f8);
          goto LAB_00151213;
        }
        anon_unknown.dwarf_9c70f::Report
                  (ctx,source,"ERROR: function type is unresolved at this point");
        iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar24 = (ExprBase *)CONCAT44(extraout_var_07,iVar17);
        pTVar20 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      }
      pEVar24->typeID = 0x29;
      pEVar24->source = source;
      pEVar24->type = pTVar20;
      pEVar24->next = (ExprBase *)0x0;
      pEVar24->listed = false;
      pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f28;
      pEVar24[1]._vptr_ExprBase = (_func_int **)value;
      uVar18 = (uint)local_8c8.head;
      uVar48 = local_8c8.head._4_4_;
      uVar31 = (uint)local_8c8.tail;
      uVar49 = local_8c8.tail._4_4_;
    }
    pEVar24[1].typeID = uVar18;
    *(undefined4 *)&pEVar24[1].field_0xc = uVar48;
    *(uint *)&pEVar24[1].source = uVar31;
    *(uint *)((long)&pEVar24[1].source + 4) = uVar49;
LAB_00150ef5:
    SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)local_7f8);
    return pEVar24;
  }
  if (local_928 == (TypeFunction *)0x0) {
    uVar33 = 0;
    if (value != (ExprBase *)0x0) {
      uVar18 = value->typeID ^ 8;
      uVar33 = (ulong)uVar18;
      if (arguments.count == 1 && uVar18 == 0) {
        if ((arguments.data)->name != (SynIdentifier *)0x0) goto LAB_001505b9;
        pTVar20 = (TypeBase *)value[1]._vptr_ExprBase;
        if ((pTVar20 == (TypeBase *)0x0) || (pTVar20->typeID != 0x16)) {
          if (pTVar20->isGeneric != true) {
            pEVar24 = CreateCast(ctx,source,(arguments.data)->value,pTVar20,true);
            return pEVar24;
          }
LAB_001514b8:
          pcVar22 = "ERROR: can\'t cast to a generic type";
          goto LAB_001514ce;
        }
LAB_001514c1:
        pcVar22 = "ERROR: generic type arguments in <> are not found after constructor name";
        goto LAB_001514ce;
      }
      if (value->typeID == 8) {
LAB_001505b9:
        pp_Var5 = value[1]._vptr_ExprBase;
        if ((pp_Var5 != (_func_int **)0x0) && (*(int *)(pp_Var5 + 1) == 0x16)) goto LAB_001514c1;
        if (*(char *)((long)pp_Var5 + 0x3c) == '\x01') goto LAB_001514b8;
      }
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar33;
    name_00.end = "";
    name_00.begin = "()";
    pEVar24 = CreateVariableAccess
                        (ctx,source,(IntrusiveList<SynIdentifier>)(auVar13 << 0x40),name_00,false);
    if (pEVar24 != (ExprBase *)0x0) {
      pAVar6 = ctx->allocator;
      lVar39 = 0x20;
      do {
        *(undefined8 *)((long)&uStack_658 + lVar39) = 0;
        *(undefined1 *)((long)&local_650 + lVar39) = 0;
        *(undefined8 *)(local_648 + lVar39) = 0;
        *(undefined8 *)(local_648 + lVar39 + 8) = 0;
        pbVar1 = local_630 + lVar39 + -8;
        pbVar1[0] = false;
        pbVar1[1] = false;
        pbVar1[2] = false;
        pbVar1[3] = false;
        pbVar1[4] = false;
        pbVar1[5] = false;
        pbVar1[6] = false;
        pbVar1[7] = false;
        pbVar1 = local_630 + lVar39;
        pbVar1[0] = false;
        pbVar1[1] = false;
        pbVar1[2] = false;
        pbVar1[3] = false;
        pbVar1[4] = false;
        pbVar1[5] = false;
        pbVar1[6] = false;
        pbVar1[7] = false;
        lVar39 = lVar39 + 0x30;
      } while (lVar39 != 0x620);
      local_648._0_8_ = local_648 + 0x10;
      local_648._12_4_ = 0x20;
      local_638 = (undefined1  [8])value->source;
      local_620 = value->type;
      local_648._8_4_ = 1;
      local_630[0] = false;
      local_628 = (TypeBase *)0x0;
      local_610 = (FunctionData *)0x0;
      local_618 = (TypeBase *)value;
      local_38 = pAVar6;
      if (uVar45 == 0) {
        uVar45 = 1;
      }
      else {
        lVar39 = 0;
        do {
          if (local_648._8_4_ == local_648._12_4_) {
            SmallArray<ArgumentData,_32U>::grow
                      ((SmallArray<ArgumentData,_32U> *)local_648,local_648._8_4_);
          }
          if ((SynBase *)local_648._0_8_ == (SynBase *)0x0) {
            pcVar22 = 
            "void SmallArray<ArgumentData, 32>::push_back(const T &) [T = ArgumentData, N = 32]";
            goto LAB_001513ca;
          }
          puVar25 = (undefined8 *)((long)&(arguments.data)->source + lVar39);
          uVar33 = (ulong)(uint)local_648._8_4_;
          local_648._8_4_ = local_648._8_4_ + 1;
          pSVar46 = (SynBase *)*puVar25;
          uVar14 = puVar25[1];
          pSVar4 = (SynIdentifier *)puVar25[2];
          pTVar20 = (TypeBase *)puVar25[3];
          pFVar41 = (FunctionData *)puVar25[5];
          (&((SynBase *)local_648._0_8_)->pos)[uVar33 * 3].begin = (char *)puVar25[4];
          (&((SynBase *)local_648._0_8_)->pos)[uVar33 * 3].end = (char *)pFVar41;
          (&((SynBase *)local_648._0_8_)->begin)[uVar33 * 6] = (Lexeme *)pSVar4;
          (&((SynBase *)local_648._0_8_)->begin + uVar33 * 6)[1] = (Lexeme *)pTVar20;
          (&((SynBase *)local_648._0_8_)->_vptr_SynBase)[uVar33 * 6] = (_func_int **)pSVar46;
          (&((SynBase *)local_648._0_8_)->_vptr_SynBase + uVar33 * 6)[1] = (_func_int **)uVar14;
          lVar39 = lVar39 + 0x30;
        } while (uVar45 * 0x30 != lVar39);
        uVar45 = (ulong)(uint)local_648._8_4_;
      }
      arguments_00._8_8_ = uVar45;
      arguments_00.data = (ArgumentData *)local_648._0_8_;
      pEVar24 = CreateFunctionCall(ctx,source,pEVar24,arguments_00,false);
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_648);
      if (pEVar24 != (ExprBase *)0x0) {
        return pEVar24;
      }
      goto LAB_00151401;
    }
    anon_unknown.dwarf_9c70f::Report
              (ctx,source,
               "ERROR: operator \'()\' accepting %d argument(s) is undefined for a class \'%.*s\'",
               uVar45,(ulong)(uint)(*(int *)&(value->type->name).end -
                                   (int)(value->type->name).begin));
  }
  else {
    if (local_928->returnType != ctx->typeAuto) {
      pMVar38 = (ModuleData *)ctx->allocator;
      lVar39 = 0x20;
      do {
        *(undefined8 *)((long)&uStack_658 + lVar39) = 0;
        *(undefined1 *)((long)&local_650 + lVar39) = 0;
        *(undefined8 *)(local_648 + lVar39) = 0;
        *(undefined8 *)(local_648 + lVar39 + 8) = 0;
        pbVar1 = local_630 + lVar39 + -8;
        pbVar1[0] = false;
        pbVar1[1] = false;
        pbVar1[2] = false;
        pbVar1[3] = false;
        pbVar1[4] = false;
        pbVar1[5] = false;
        pbVar1[6] = false;
        pbVar1[7] = false;
        pbVar1 = local_630 + lVar39;
        pbVar1[0] = false;
        pbVar1[1] = false;
        pbVar1[2] = false;
        pbVar1[3] = false;
        pbVar1[4] = false;
        pbVar1[5] = false;
        pbVar1[6] = false;
        pbVar1[7] = false;
        lVar39 = lVar39 + 0x30;
      } while (lVar39 != 0x1a0);
      pSVar46 = (SynBase *)(local_648 + 0x10);
      local_648._8_4_ = 0;
      local_648._12_4_ = 8;
      pTVar35 = (local_928->arguments).head;
      local_4b8 = pMVar38;
      if (pTVar35 != (TypeHandle *)0x0) {
        do {
          pTVar20 = pTVar35->type;
          if (local_648._8_4_ == local_648._12_4_) {
            local_648._0_8_ = pSVar46;
            SmallArray<ArgumentData,_8U>::grow
                      ((SmallArray<ArgumentData,_8U> *)local_648,local_648._8_4_);
            pSVar46 = (SynBase *)local_648._0_8_;
          }
          if (pSVar46 == (SynBase *)0x0) {
            pcVar22 = 
            "void SmallArray<ArgumentData, 8>::push_back(const T &) [T = ArgumentData, N = 8]";
LAB_001513ca:
            local_648._0_8_ = (SynBase *)0x0;
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,pcVar22);
          }
          uVar33 = (ulong)(uint)local_648._8_4_;
          local_648._8_4_ = local_648._8_4_ + 1;
          (&pSVar46->_vptr_SynBase)[uVar33 * 6] = (_func_int **)0x0;
          *(bool *)((long)&pSVar46->typeID + uVar33 * 0x30) = false;
          (&pSVar46->begin)[uVar33 * 6] = (Lexeme *)0x0;
          (&pSVar46->end)[uVar33 * 6] = (Lexeme *)pTVar20;
          (&pSVar46->pos)[uVar33 * 3].begin = (char *)0x0;
          (&pSVar46->pos)[uVar33 * 3].end = (char *)0x0;
          pTVar35 = pTVar35->next;
        } while (pTVar35 != (TypeHandle *)0x0);
        pMVar38 = (ModuleData *)ctx->allocator;
      }
      uVar48 = local_648._8_4_;
      local_648._0_8_ = pSVar46;
      memset((ArgumentData *)(local_760 + 0x10),0,0x100);
      local_760._8_4_ = 0;
      local_760._12_4_ = 0x10;
      functionArguments_01.count = uVar48;
      functionArguments_01.data = (ArgumentData *)pSVar46;
      functionArguments_01._12_4_ = 0;
      arguments_05._12_4_ = 0;
      arguments_05.data = (ArgumentData *)auVar15._0_8_;
      arguments_05.count = auVar15._8_4_;
      local_760._0_8_ = (ArgumentData *)(local_760 + 0x10);
      local_650 = pMVar38;
      bVar47 = PrepareArgumentsForFunctionCall
                         (ctx,source,functionArguments_01,arguments_05,
                          (SmallArray<CallArgumentData,_16U> *)local_760,(uint *)0x0,true);
      if (bVar47) {
        if (local_760._8_4_ != 0) {
          lVar39 = 8;
          uVar45 = 0;
          do {
            IntrusiveList<ExprBase>::push_back
                      (&local_8c8,*(ExprBase **)((long)(TypeBase **)local_760._0_8_ + lVar39));
            uVar45 = uVar45 + 1;
            lVar39 = lVar39 + 0x10;
          } while (uVar45 < (uint)local_760._8_4_);
        }
      }
      else if (allowFailure) {
        pEVar29 = (ExpressionContext *)0x0;
      }
      else {
        pcVar22 = ctx->errorBuf;
        if ((pcVar22 != (char *)0x0) && (ctx->errorBufSize != 0)) {
          if (ctx->errorCount == 0) {
            ctx->errorPos = (source->pos).begin;
            ctx->errorBufLocation = pcVar22;
            pcVar42 = pcVar22;
          }
          else {
            pcVar42 = ctx->errorBufLocation;
          }
          iVar17 = (int)pcVar42;
          uVar18 = ctx->errorBufSize + ((int)pcVar22 - iVar17);
          if (arguments.count == local_648._8_4_) {
            iVar30 = NULLC::SafeSprintf(pcVar42,(ulong)uVar18,
                                        "ERROR: there is no conversion from specified arguments and the ones that function accepts\n"
                                       );
          }
          else {
            iVar30 = NULLC::SafeSprintf(pcVar42,(ulong)uVar18,
                                        "ERROR: function expects %d argument(s), while %d are supplied\n"
                                        ,(ulong)(uint)local_648._8_4_,uVar45);
          }
          iVar19 = NULLC::SafeSprintf(pcVar42 + iVar30,(ulong)(uVar18 - iVar30),"\tExpected: (");
          pcVar22 = pcVar42 + iVar30 + iVar19;
          if (local_648._8_4_ != 0) {
            lVar39 = 0;
            uVar45 = 0;
            do {
              pcVar34 = ", ";
              if (lVar39 == 0) {
                pcVar34 = "";
              }
              lVar2 = *(long *)((long)&((SynBase *)local_648._0_8_)->end + lVar39);
              iVar30 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar17 - (int)pcVar22) + uVar18),"%s%.*s"
                                          ,pcVar34,(ulong)(uint)(*(int *)(lVar2 + 0x18) -
                                                                (int)*(undefined8 *)(lVar2 + 0x10)))
              ;
              pcVar22 = pcVar22 + iVar30;
              uVar45 = uVar45 + 1;
              lVar39 = lVar39 + 0x30;
            } while (uVar45 < (uint)local_648._8_4_);
          }
          iVar30 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar17 - (int)pcVar22) + uVar18),")\n");
          pcVar22 = pcVar22 + iVar30;
          iVar30 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar17 - (int)pcVar22) + uVar18),
                                      "\tProvided: (");
          pcVar22 = pcVar22 + iVar30;
          if (arguments.count != 0) {
            lVar39 = 0;
            uVar45 = 0;
            do {
              pcVar34 = ", ";
              if (lVar39 == 0) {
                pcVar34 = "";
              }
              lVar2 = *(long *)((long)&(arguments.data)->type + lVar39);
              iVar30 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar17 - (int)pcVar22) + uVar18),"%s%.*s"
                                          ,pcVar34,(ulong)(uint)(*(int *)(lVar2 + 0x18) -
                                                                (int)*(undefined8 *)(lVar2 + 0x10)))
              ;
              pcVar22 = pcVar22 + iVar30;
              uVar45 = uVar45 + 1;
              lVar39 = lVar39 + 0x30;
            } while (uVar45 < arguments.count);
          }
          NULLC::SafeSprintf(pcVar22,(ulong)((iVar17 - (int)pcVar22) + uVar18),")");
          pcVar22 = ctx->errorBufLocation;
          sVar23 = strlen(pcVar22);
          pcVar22 = pcVar22 + sVar23;
          ctx->errorBufLocation = pcVar22;
          anon_unknown.dwarf_9c70f::AddErrorInfoWithLocation
                    (ctx,&ctx->errorInfo,source,pcVar42,pcVar22);
        }
        if (ctx->errorHandlerNested == true) {
          if (ctx->errorHandlerActive == false) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1e4e,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          goto LAB_001514df;
        }
        ctx->errorCount = ctx->errorCount + 1;
        local_7f8 = (undefined1  [8])0x0;
        pMStack_7f0 = (ModuleData *)0x0;
        if ((ulong)arguments.count != 0) {
          lVar39 = 0;
          do {
            iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar24 = *(ExprBase **)((long)&(arguments.data)->value + lVar39);
            ExprPassthrough::ExprPassthrough
                      ((ExprPassthrough *)CONCAT44(extraout_var_12,iVar17),pEVar24->source,
                       pEVar24->type,pEVar24);
            IntrusiveList<ExprBase>::push_back
                      ((IntrusiveList<ExprBase> *)local_7f8,
                       (ExprBase *)CONCAT44(extraout_var_12,iVar17));
            lVar39 = lVar39 + 0x30;
          } while ((ulong)arguments.count * 0x30 != lVar39);
        }
        iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar29 = (ExpressionContext *)CONCAT44(extraout_var_13,iVar17);
        pTVar20 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        *(uint *)&pEVar29->code = 0x29;
        pEVar29->codeEnd = (char *)source;
        pEVar29->moduleRoot = (char *)pTVar20;
        (pEVar29->uniqueDependencies).data = (ModuleData **)0x0;
        *(bool *)&(pEVar29->uniqueDependencies).count = false;
        *(undefined ***)pEVar29 = &PTR__ExprBase_00223f28;
        (pEVar29->uniqueDependencies).little[0] = (ModuleData *)value;
        (pEVar29->uniqueDependencies).little[1] = (ModuleData *)local_7f8;
        (pEVar29->uniqueDependencies).little[2] = pMStack_7f0;
      }
      SmallArray<CallArgumentData,_16U>::~SmallArray((SmallArray<CallArgumentData,_16U> *)local_760)
      ;
      SmallArray<ArgumentData,_8U>::~SmallArray((SmallArray<ArgumentData,_8U> *)local_648);
      local_918 = (ExprFunctionAccess *)value;
      if (!bVar47) {
        return (ExprBase *)pEVar29;
      }
LAB_00151213:
      if (local_928 == (TypeFunction *)0x0) {
LAB_00151401:
        __assert_fail("type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1e8b,
                      "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      if ((local_928->super_TypeBase).isGeneric == true) {
        pcVar22 = "ERROR: generic function call is not supported";
LAB_001514ce:
        anon_unknown.dwarf_9c70f::Stop(ctx,source,pcVar22);
      }
      iVar17 = 0;
      iVar30 = 0;
      if (local_8c8.head != (ExprBase *)0x0) {
        iVar30 = 0;
        pEVar24 = local_8c8.head;
        do {
          iVar30 = iVar30 + 1;
          pEVar24 = pEVar24->next;
        } while (pEVar24 != (ExprBase *)0x0);
      }
      pTVar35 = (local_928->arguments).head;
      if (pTVar35 != (TypeHandle *)0x0) {
        iVar17 = 0;
        pTVar43 = pTVar35;
        do {
          iVar17 = iVar17 + 1;
          pTVar43 = pTVar43->next;
        } while (pTVar43 != (TypeHandle *)0x0);
      }
      pEVar24 = local_8c8.head;
      if (iVar30 != iVar17) {
        __assert_fail("actualArguments.size() == type->arguments.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1e90,
                      "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      for (; (pEVar24 != (ExprBase *)0x0 && (pTVar35 != (TypeHandle *)0x0)); pTVar35 = pTVar35->next
          ) {
        if (pEVar24->type != pTVar35->type) {
          __assert_fail("actual->type == expected->type",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x1e97,
                        "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                       );
        }
        pEVar24 = pEVar24->next;
      }
      if (pEVar24 != (ExprBase *)0x0) {
        __assert_fail("actual == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1e99,
                      "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      if (pTVar35 != (TypeHandle *)0x0) {
        __assert_fail("expected == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1e9a,
                      "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar24 = (ExprBase *)CONCAT44(extraout_var_14,iVar17);
      pTVar20 = local_928->returnType;
      pEVar24->typeID = 0x29;
      pEVar24->source = source;
      pEVar24->type = pTVar20;
      pEVar24->next = (ExprBase *)0x0;
      pEVar24->listed = false;
      pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f28;
      pEVar24[1]._vptr_ExprBase = (_func_int **)local_918;
      local_648._0_4_ = (uint)local_8c8.head;
      local_648._4_4_ = local_8c8.head._4_4_;
      local_648._8_4_ = (uint)local_8c8.tail;
      local_648._12_4_ = local_8c8.tail._4_4_;
      goto LAB_0014fa73;
    }
    anon_unknown.dwarf_9c70f::Report(ctx,source,"ERROR: function type is unresolved at this point");
  }
  iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar24 = (ExprBase *)CONCAT44(extraout_var_03,iVar17);
  pTVar20 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  pEVar24->typeID = 0x29;
  pEVar24->source = source;
  pEVar24->type = pTVar20;
  pEVar24->next = (ExprBase *)0x0;
  pEVar24->listed = false;
  pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f28;
  pEVar24[1]._vptr_ExprBase = (_func_int **)value;
  local_648._0_4_ = 0;
  local_648._4_4_ = 0;
  local_648._8_4_ = 0;
  local_648._12_4_ = 0;
LAB_0014fa73:
  pEVar24[1].typeID = local_648._0_4_;
  *(undefined4 *)&pEVar24[1].field_0xc = local_648._4_4_;
  *(undefined4 *)&pEVar24[1].source = local_648._8_4_;
  *(undefined4 *)((long)&pEVar24[1].source + 4) = local_648._12_4_;
  return pEVar24;
}

Assistant:

ExprBase* CreateFunctionCallFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool allowFailure)
{
	bool isErrorCall = false;

	if(value)
	{
		if(isType<TypeError>(value->type))
			isErrorCall = true;
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type) || !AssertResolvableTypeLiteral(ctx, source, arguments[i].value))
			isErrorCall = true;
	}

	for(TypeHandle *curr = generics.head; curr; curr = curr->next)
	{
		if(isType<TypeError>(curr->type) || !AssertResolvableType(ctx, source, curr->type, false))
			isErrorCall = true;
	}

	if(isErrorCall)
	{
		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
	}

	TypeFunction *type = value ? getType<TypeFunction>(value->type) : NULL;

	IntrusiveList<ExprBase> actualArguments;

	if(!functions.empty())
	{
		SmallArray<unsigned, 32> ratings(ctx.allocator);

		FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, generics, arguments, ratings);

		// Didn't find an appropriate function
		if(!bestOverload)
		{
			if(allowFailure)
				return NULL;

			// auto ref -> type cast
			if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && arguments[0].type == ctx.typeAutoRef && !arguments[0].name)
			{
				ExprBase *result = CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);

				// If this was a member function call, store to context
				if(!isType<ExprNullptrLiteral>(functions[0].context))
					return CreateAssignment(ctx, source, functions[0].context, result);

				return result;
			}

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(functions[0].function->name->name));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, ~0u, true);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		unsigned bestRating = ~0u;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function == bestOverload.function)
				bestRating = ratings[i];
		}

		// Check if multiple functions share the same rating
		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function != bestOverload.function && ratings[i] == bestRating)
			{
				// For a function call through 'auto ref' it is ok to have the same function signature in different types
				if(isType<TypeAutoRef>(bestOverload.context->type) && ctx.IsGenericFunction(functions[i].function) && ctx.IsGenericFunction(bestOverload.function))
				{
					TypeFunction *instanceA = NULL;
					IntrusiveList<MatchData> aliasesA;
					SmallArray<CallArgumentData, 16> resultA(ctx.allocator);

					// Handle named argument order, default argument values and variadic functions
					if(PrepareArgumentsForFunctionCall(ctx, source, functions[i].function->arguments, arguments, resultA, NULL, false))
						instanceA = GetGenericFunctionInstanceType(ctx, source, functions[i].function->scope->ownerType, functions[i].function, resultA, aliasesA);

					TypeFunction *instanceB = NULL;
					IntrusiveList<MatchData> aliasesB;
					SmallArray<CallArgumentData, 16> resultB(ctx.allocator);

					if(PrepareArgumentsForFunctionCall(ctx, source, bestOverload.function->arguments, arguments, resultB, NULL, false))
						instanceB = GetGenericFunctionInstanceType(ctx, source, bestOverload.function->scope->ownerType, bestOverload.function, resultB, aliasesB);

					if(instanceA && instanceB && instanceA == instanceB)
						continue;
				}

				if(ctx.errorBuf && ctx.errorBufSize)
				{
					if(ctx.errorCount == 0)
					{
						ctx.errorPos = source->pos.begin;
						ctx.errorBufLocation = ctx.errorBuf;
					}

					const char *messageStart = ctx.errorBufLocation;

					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available for the call:\n");

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, bestRating, true);

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);
				}

				if(ctx.errorHandlerNested)
				{
					assert(ctx.errorHandlerActive);

					longjmp(ctx.errorHandler, 1);
				}

				ctx.errorCount++;

				IntrusiveList<ExprBase> errorArguments;

				for(unsigned i = 0; i < arguments.size(); i++)
					errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
			}
		}

		FunctionData *function = bestOverload.function;

		type = getType<TypeFunction>(function->type);

		if(isType<TypeAutoRef>(bestOverload.context->type))
		{
			InplaceStr baseName = bestOverload.function->name->name;

			if(bestOverload.function->scope->ownerType)
			{
				if(const char *pos = strstr(baseName.begin, "::"))
					baseName = InplaceStr(pos + 2);
			}

			// For function call through 'auto ref', we have to instantiate all matching member functions of generic types
			for(unsigned i = 0; i < ctx.functions.size(); i++)
			{
				FunctionData *el = ctx.functions[i];

				if(!el->scope->ownerType)
					continue;

				if(!el->scope->ownerType->isGeneric && !el->type->isGeneric)
					continue;

				unsigned hash = NULLC::StringHashContinue(el->scope->ownerType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, baseName.begin, baseName.end);

				if(el->nameHash != hash)
					continue;

				if(el->generics.size() != generics.size())
					continue;

				if(el->type->arguments.size() != bestOverload.function->type->arguments.size())
					continue;

				if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(el->scope->ownerType))
				{
					for(unsigned k = 0; k < proto->instances.size(); k++)
					{
						ExprClassDefinition *definition = getType<ExprClassDefinition>(proto->instances[k]);

						ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(definition->classType));

						if(bestOverload.function->scope->ownerType->isGeneric)
						{
							FunctionValue instance = CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, false);

							bestOverload.function = instance.function;

							function = instance.function;

							type = getType<TypeFunction>(function->type);
						}
						else
						{
							CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
						}
					}
				}
				else
				{
					ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(el->scope->ownerType));

					CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
				}
			}
		}

		if(ctx.IsGenericFunction(function))
		{
			bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, generics, arguments, false);

			if(!bestOverload)
				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);

			function = bestOverload.function;

			type = getType<TypeFunction>(function->type);
		}

		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		if(IsVirtualFunctionCall(ctx, function, bestOverload.context->type))
		{
			ExprBase *table = GetFunctionTable(ctx, source, bestOverload.function);

			value = CreateFunctionCall2(ctx, source, InplaceStr("__redirect"), bestOverload.context, table, false, true, true);

			value = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, value, EXPR_CAST_REINTERPRET);
		}
		else
		{
			value = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, function->type, function, bestOverload.context);
		}

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, true);

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(type)
	{
		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		SmallArray<ArgumentData, 8> functionArguments(ctx.allocator);

		for(TypeHandle *argType = type->arguments.head; argType; argType = argType->next)
			functionArguments.push_back(ArgumentData(NULL, false, NULL, argType->type, NULL));

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		if(!PrepareArgumentsForFunctionCall(ctx, source, functionArguments, arguments, result, NULL, true))
		{
			if(allowFailure)
				return NULL;

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				char *errorBuf = ctx.errorBufLocation;
				unsigned errorBufSize = ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf);

				char *errPos = ctx.errorBufLocation;

				if(arguments.size() != functionArguments.size())
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: function expects %d argument(s), while %d are supplied\n", functionArguments.size(), arguments.size());
				else
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: there is no conversion from specified arguments and the ones that function accepts\n");

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tExpected: (");

				for(unsigned i = 0; i < functionArguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(functionArguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")\n");
			
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tProvided: (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && !arguments[0].name)
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Function-style type casts
		return CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);
	}
	else
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Call operator()
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("()"), false))
		{
			SmallArray<ArgumentData, 32> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(value->source, false, NULL, value->type, value));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, callArguments, false))
				return result;
		}
		else
		{
			Report(ctx, source, "ERROR: operator '()' accepting %d argument(s) is undefined for a class '%.*s'", arguments.size(), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}
	}

	assert(type);

	if(type->isGeneric)
		Stop(ctx, source, "ERROR: generic function call is not supported");

	assert(actualArguments.size() == type->arguments.size());

	{
		ExprBase *actual = actualArguments.head;
		TypeHandle *expected = type->arguments.head;

		for(; actual && expected; actual = actual->next, expected = expected->next)
			assert(actual->type == expected->type);

		assert(actual == NULL);
		assert(expected == NULL);
	}

	return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, type->returnType, value, actualArguments);
}